

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_node.hpp
# Opt level: O2

unsafe_optional_ptr<Node>
duckdb::BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::GetNextChild
          (BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *n,uint8_t *byte)

{
  uint8_t *puVar1;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *pBVar2;
  uint8_t i;
  ulong uVar3;
  
  uVar3 = 0;
  pBVar2 = n;
  do {
    if (n->count == uVar3) {
      return (unsafe_optional_ptr<Node>)(Node *)0x0;
    }
    puVar1 = n->key + uVar3;
    uVar3 = uVar3 + 1;
    pBVar2 = (BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *)pBVar2->children;
  } while (*puVar1 < *byte);
  *byte = *puVar1;
  return (unsafe_optional_ptr<Node>)pBVar2;
}

Assistant:

static unsafe_optional_ptr<Node> GetNextChild(BaseNode &n, uint8_t &byte) {
		for (uint8_t i = 0; i < n.count; i++) {
			if (n.key[i] >= byte) {
				byte = n.key[i];
				return &n.children[i];
			}
		}
		return nullptr;
	}